

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall wallet::WalletBatch::EraseAddressData(WalletBatch *this,CTxDestination *dest)

{
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> _Var1;
  int iVar2;
  long in_FS_OFFSET;
  DataStream prefix;
  DataStream local_58;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_read_pos = 0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Serialize<DataStream,char>
            (&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DBKeys::DESTDATA_abi_cxx11_);
  EncodeDestination_abi_cxx11_(&local_38,dest);
  Serialize<DataStream,char>(&local_58,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  _Var1._M_head_impl =
       (this->m_batch)._M_t.
       super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
       _M_t.
       super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
       super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
  iVar2 = (*(_Var1._M_head_impl)->_vptr_DatabaseBatch[8])
                    (_Var1._M_head_impl,
                     local_58.vch.
                     super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start + local_58.m_read_pos,
                     (long)local_58.vch.
                           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_58.vch.
                            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start + local_58.m_read_pos));
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return SUB41(iVar2,0);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseAddressData(const CTxDestination& dest)
{
    DataStream prefix;
    prefix << DBKeys::DESTDATA << EncodeDestination(dest);
    return m_batch->ErasePrefix(prefix);
}